

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

bool __thiscall amrex::Box::strictly_contains(Box *this,int i,int j,int k)

{
  bool local_75;
  int k_local;
  int j_local;
  int i_local;
  Box *this_local;
  
  local_75 = false;
  if ((this->smallend).vect[0] < i) {
    local_75 = false;
    if (i < (this->bigend).vect[0]) {
      local_75 = false;
      if ((this->smallend).vect[1] < j) {
        local_75 = false;
        if (j < (this->bigend).vect[1]) {
          local_75 = false;
          if ((this->smallend).vect[2] < k) {
            local_75 = k < (this->bigend).vect[2];
          }
        }
      }
    }
  }
  return local_75;
}

Assistant:

bool strictly_contains (int i, int j, int k) const noexcept {
#endif
        return AMREX_D_TERM(i > smallend[0] && i < bigend[0],
                         && j > smallend[1] && j < bigend[1],
                         && k > smallend[2] && k < bigend[2]);
    }